

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O0

CURLcode Curl_input_ntlm(connectdata *conn,_Bool proxy,char *header)

{
  int iVar1;
  CURLcode CVar2;
  ushort **ppuVar3;
  bool bVar4;
  ntlmdata *local_40;
  CURLcode result;
  ntlmdata *ntlm;
  char *header_local;
  _Bool proxy_local;
  connectdata *conn_local;
  
  if (proxy) {
    local_40 = &conn->proxyntlm;
  }
  else {
    local_40 = &conn->ntlm;
  }
  iVar1 = curl_strnequal("NTLM",header,4);
  if (iVar1 != 0) {
    ntlm = (ntlmdata *)(header + 4);
    while( true ) {
      bVar4 = false;
      if ((char)ntlm->state != NTLMSTATE_NONE) {
        ppuVar3 = __ctype_b_loc();
        bVar4 = ((*ppuVar3)[(int)(uint)(byte)(char)ntlm->state] & 0x2000) != 0;
      }
      if (!bVar4) break;
      ntlm = (ntlmdata *)((long)&ntlm->state + 1);
    }
    if ((char)ntlm->state == NTLMSTATE_NONE) {
      if (local_40->state == NTLMSTATE_LAST) {
        Curl_infof(conn->data,"NTLM auth restarted\n");
        Curl_http_ntlm_cleanup(conn);
      }
      else {
        if (local_40->state == NTLMSTATE_TYPE3) {
          Curl_infof(conn->data,"NTLM handshake rejected\n");
          Curl_http_ntlm_cleanup(conn);
          local_40->state = NTLMSTATE_NONE;
          return CURLE_REMOTE_ACCESS_DENIED;
        }
        if (local_40->state != NTLMSTATE_NONE) {
          Curl_infof(conn->data,"NTLM handshake failure (internal error)\n");
          return CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      local_40->state = NTLMSTATE_TYPE1;
    }
    else {
      CVar2 = Curl_auth_decode_ntlm_type2_message(conn->data,(char *)ntlm,local_40);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      local_40->state = NTLMSTATE_TYPE2;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_input_ntlm(struct connectdata *conn,
                         bool proxy,         /* if proxy or not */
                         const char *header) /* rest of the www-authenticate:
                                                header */
{
  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  CURLcode result = CURLE_OK;

  ntlm = proxy ? &conn->proxyntlm : &conn->ntlm;

  if(checkprefix("NTLM", header)) {
    header += strlen("NTLM");

    while(*header && ISSPACE(*header))
      header++;

    if(*header) {
      result = Curl_auth_decode_ntlm_type2_message(conn->data, header, ntlm);
      if(result)
        return result;

      ntlm->state = NTLMSTATE_TYPE2; /* We got a type-2 message */
    }
    else {
      if(ntlm->state == NTLMSTATE_LAST) {
        infof(conn->data, "NTLM auth restarted\n");
        Curl_http_ntlm_cleanup(conn);
      }
      else if(ntlm->state == NTLMSTATE_TYPE3) {
        infof(conn->data, "NTLM handshake rejected\n");
        Curl_http_ntlm_cleanup(conn);
        ntlm->state = NTLMSTATE_NONE;
        return CURLE_REMOTE_ACCESS_DENIED;
      }
      else if(ntlm->state >= NTLMSTATE_TYPE1) {
        infof(conn->data, "NTLM handshake failure (internal error)\n");
        return CURLE_REMOTE_ACCESS_DENIED;
      }

      ntlm->state = NTLMSTATE_TYPE1; /* We should send away a type-1 */
    }
  }

  return result;
}